

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void fread_pet(CHAR_DATA *ch,FILE *fp)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MOB_INDEX_DATA *pMVar5;
  AFFECT_DATA *pAVar6;
  int *piVar7;
  char *pcVar8;
  FILE *fp_00;
  FILE *in_RSI;
  CHAR_DATA *in_RDI;
  MOB_INDEX_DATA *unaff_retaddr;
  int stat_1;
  int stat;
  int sn;
  AFFECT_DATA *paf;
  char *afname;
  char *owner;
  CHAR_DATA *wch;
  int i;
  int vnum;
  int percent;
  int lastlogoff;
  bool fMatch;
  CHAR_DATA *pet;
  char *word;
  FILE *in_stack_00002350;
  FILE *in_stack_00003f48;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string_view<char,_std::char_traits<char>_> *local_b8;
  FILE *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string_view in_stack_ffffffffffffff70;
  CHAR_DATA *local_60;
  int local_54;
  int local_2c;
  int local_28;
  byte local_21;
  CHAR_DATA *local_20;
  basic_string_view<char,_std::char_traits<char>_> *local_18;
  FILE *local_10;
  CHAR_DATA *local_8;
  
  local_28 = (int)current_time;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar2 = feof(in_RSI);
  if (iVar2 == 0) {
    local_b8 = (basic_string_view<char,_std::char_traits<char>_> *)
               fread_word(in_stack_ffffffffffffff50);
  }
  else {
    local_b8 = (basic_string_view<char,_std::char_traits<char>_> *)0x7cf18a;
  }
  local_18 = local_b8;
  bVar1 = str_cmp((char *)local_b8,"Vnum");
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    fmt._M_str._0_4_ = in_stack_ffffffffffffff60;
    fmt._M_len = (size_t)in_stack_ffffffffffffff58;
    fmt._M_str._4_4_ = in_stack_ffffffffffffff64;
    CLogger::Warn<>((CLogger *)in_stack_ffffffffffffff50,fmt);
    get_mob_index(in_stack_ffffffffffffff3c);
    local_20 = create_mobile(unaff_retaddr);
  }
  else {
    fread_number(in_stack_00002350);
    pMVar5 = get_mob_index(in_stack_ffffffffffffff3c);
    if (pMVar5 == (MOB_INDEX_DATA *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,
                 (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      CLogger::Warn<int&>((CLogger *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff70,
                          (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      get_mob_index(in_stack_ffffffffffffff3c);
      local_20 = create_mobile(unaff_retaddr);
    }
    else {
      get_mob_index(in_stack_ffffffffffffff3c);
      local_20 = create_mobile(unaff_retaddr);
    }
  }
  do {
    iVar2 = feof(local_10);
    if (iVar2 == 0) {
      this = (basic_string_view<char,_std::char_traits<char>_> *)
             fread_word(in_stack_ffffffffffffff50);
    }
    else {
      this = (basic_string_view<char,_std::char_traits<char>_> *)0x7cf18a;
    }
    local_21 = 0;
    if (((char)this->_M_len < 'a') || ('z' < (char)this->_M_len)) {
      iVar2 = (int)(char)this->_M_len;
    }
    else {
      iVar2 = (char)this->_M_len + -0x20;
    }
    fp_00 = (FILE *)(ulong)(iVar2 - 0x2a);
    local_18 = this;
    switch(fp_00) {
    case (FILE *)0x0:
      local_21 = 1;
      fread_to_eol(fp_00);
      break;
    case (FILE *)0x17:
      bVar1 = str_cmp((char *)this,"Act");
      if (bVar1) {
        bVar1 = str_cmp((char *)local_18,"AfBy");
        if (bVar1) {
          bVar1 = str_cmp((char *)local_18,"Alig");
          if (bVar1) {
            bVar1 = str_cmp((char *)local_18,"ACs");
            if (bVar1) {
              bVar1 = str_cmp((char *)local_18,"Affc");
              if (bVar1) {
                bVar1 = str_cmp((char *)local_18,"AMod");
                if (bVar1) {
                  bVar1 = str_cmp((char *)local_18,"Attr");
                  if (!bVar1) {
                    for (iVar4 = 0; iVar4 < 5; iVar4 = iVar4 + 1) {
                      iVar3 = fread_number(in_stack_00002350);
                      local_20->perm_stat[iVar4] = (short)iVar3;
                    }
                    local_21 = 1;
                  }
                }
                else {
                  for (iVar4 = 0; iVar4 < 5; iVar4 = iVar4 + 1) {
                    iVar3 = fread_number(in_stack_00002350);
                    local_20->mod_stat[iVar4] = (short)iVar3;
                  }
                  local_21 = 1;
                }
              }
              else {
                pAVar6 = new_affect();
                init_affect((AFFECT_DATA *)0x62fa8c);
                fread_word(in_stack_ffffffffffffff50);
                iVar4 = skill_lookup((char *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
                if (iVar4 < 0) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (this,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
                  fmt_00._M_str._0_4_ = in_stack_ffffffffffffff60;
                  fmt_00._M_len = (size_t)in_stack_ffffffffffffff58;
                  fmt_00._M_str._4_4_ = in_stack_ffffffffffffff64;
                  CLogger::Warn<>((CLogger *)in_stack_ffffffffffffff50,fmt_00);
                }
                else {
                  pAVar6->type = (short)iVar4;
                }
                iVar4 = fread_number(in_stack_00002350);
                pAVar6->where = (short)iVar4;
                iVar4 = fread_number(in_stack_00002350);
                pAVar6->level = (short)iVar4;
                iVar4 = fread_number(in_stack_00002350);
                pAVar6->duration = (short)iVar4;
                iVar4 = fread_number(in_stack_00002350);
                pAVar6->modifier = (short)iVar4;
                iVar4 = fread_number(in_stack_00002350);
                pAVar6->location = (short)iVar4;
                fread_flag_new((long *)this,(FILE *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
                iVar4 = fread_number(in_stack_00002350);
                pAVar6->aftype = iVar4;
                pcVar8 = fread_word(in_stack_ffffffffffffff50);
                iVar4 = strcmp(pcVar8,"none");
                if (iVar4 != 0) {
                  pAVar6->owner = local_8;
                }
                for (local_60 = char_list; local_60 != (CHAR_DATA *)0x0; local_60 = local_60->next)
                {
                  bVar1 = str_cmp(local_60->name,pcVar8);
                  if (!bVar1) {
                    pAVar6->owner = local_60;
                    break;
                  }
                }
                pcVar8 = fread_word(in_stack_ffffffffffffff50);
                bVar1 = str_cmp(pcVar8,"none");
                if (bVar1) {
                  pcVar8 = palloc_string(in_stack_ffffffffffffff58);
                  pAVar6->name = pcVar8;
                }
                pAVar6->next = local_20->affected;
                local_20->affected = pAVar6;
                local_21 = 1;
              }
            }
            else {
              for (local_54 = 0; local_54 < 4; local_54 = local_54 + 1) {
                iVar4 = fread_number(in_stack_00002350);
                local_20->armor[local_54] = (short)iVar4;
              }
              local_21 = 1;
            }
          }
          else {
            iVar4 = fread_number(in_stack_00002350);
            local_20->alignment = (short)iVar4;
            local_21 = 1;
          }
        }
        else {
          fread_flag_new((long *)this,(FILE *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
          local_21 = 1;
        }
      }
      else {
        fread_flag_new((long *)this,(FILE *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
        local_21 = 1;
      }
      break;
    case (FILE *)0x19:
      bVar1 = str_cmp((char *)this,"Comm");
      if (bVar1) {
        bVar1 = str_cmp((char *)local_18,"Cabal");
        if (!bVar1) {
          fread_string(in_stack_00003f48);
          iVar4 = cabal_lookup((char *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
          local_20->cabal = (short)iVar4;
          local_21 = 1;
        }
      }
      else {
        fread_flag_new((long *)this,(FILE *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
        local_21 = 1;
      }
      break;
    case (FILE *)0x1a:
      bVar1 = str_cmp((char *)this,"Dam");
      if (bVar1) {
        bVar1 = str_cmp((char *)local_18,"Desc");
        if (!bVar1) {
          pcVar8 = fread_string(in_stack_00003f48);
          local_20->description = pcVar8;
          local_21 = 1;
        }
      }
      else {
        iVar4 = fread_number(in_stack_00002350);
        local_20->damroll = (short)iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x1b:
      bVar1 = str_cmp((char *)this,"End");
      if (!bVar1) {
        local_20->leader = local_8;
        local_20->master = local_8;
        local_8->pet = local_20;
        local_2c = (int)(((current_time - local_28) * 0x19) / 0x1c20);
        if (((0 < local_2c) &&
            (bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff38),
                                    (int)((ulong)fp_00 >> 0x20)), !bVar1)) &&
           (bVar1 = is_affected_by((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffff38),
                                   (int)((ulong)fp_00 >> 0x20)), !bVar1)) {
          piVar7 = std::min<int>(&local_2c,(int *)&stack0xffffffffffffff64);
          iVar2 = *piVar7;
          local_20->hit = (((int)local_20->max_hit - local_20->hit) * iVar2) / 100 + local_20->hit;
          local_20->mana =
               local_20->mana +
               (short)((((int)local_20->max_mana - (int)local_20->mana) * iVar2) / 100);
          local_20->move =
               local_20->move +
               (short)((((int)local_20->max_move - (int)local_20->move) * iVar2) / 100);
        }
        return;
      }
      bVar1 = str_cmp((char *)local_18,"Exp");
      if (!bVar1) {
        iVar4 = fread_number(in_stack_00002350);
        local_20->exp = iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x1d:
      bVar1 = str_cmp((char *)this,"Gold");
      if (!bVar1) {
        iVar4 = fread_number(in_stack_00002350);
        local_20->gold = (long)iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x1e:
      bVar1 = str_cmp((char *)this,"Hit");
      if (bVar1) {
        bVar1 = str_cmp((char *)local_18,"HMV");
        if (!bVar1) {
          iVar4 = fread_number(in_stack_00002350);
          local_20->hit = iVar4;
          iVar4 = fread_number(in_stack_00002350);
          local_20->max_hit = (short)iVar4;
          iVar4 = fread_number(in_stack_00002350);
          local_20->mana = (short)iVar4;
          iVar4 = fread_number(in_stack_00002350);
          local_20->max_mana = (short)iVar4;
          iVar4 = fread_number(in_stack_00002350);
          local_20->move = (short)iVar4;
          iVar4 = fread_number(in_stack_00002350);
          local_20->max_move = (short)iVar4;
          local_21 = 1;
        }
      }
      else {
        iVar4 = fread_number(in_stack_00002350);
        local_20->hitroll = (short)iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x22:
      bVar1 = str_cmp((char *)this,"Levl");
      if (bVar1) {
        bVar1 = str_cmp((char *)local_18,"LnD");
        if (bVar1) {
          bVar1 = str_cmp((char *)local_18,"LogO");
          if (!bVar1) {
            local_28 = fread_number(in_stack_00002350);
            local_21 = 1;
          }
        }
        else {
          pcVar8 = fread_string(in_stack_00003f48);
          local_20->long_descr = pcVar8;
          local_21 = 1;
        }
      }
      else {
        iVar4 = fread_number(in_stack_00002350);
        local_20->level = (short)iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x24:
      bVar1 = str_cmp((char *)this,"Name");
      if (!bVar1) {
        pcVar8 = fread_string(in_stack_00003f48);
        local_20->name = pcVar8;
        local_21 = 1;
      }
      break;
    case (FILE *)0x26:
      bVar1 = str_cmp((char *)this,"Pos");
      if (!bVar1) {
        iVar4 = fread_number(in_stack_00002350);
        local_20->position = (short)iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x28:
      bVar1 = str_cmp((char *)this,"Race");
      if (!bVar1) {
        fread_string(in_stack_00003f48);
        iVar4 = race_lookup((char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_20->race = (short)iVar4;
        local_21 = 1;
      }
      break;
    case (FILE *)0x29:
      bVar1 = str_cmp((char *)this,"Save");
      if (bVar1) {
        bVar1 = str_cmp((char *)local_18,"Sex");
        if (bVar1) {
          bVar1 = str_cmp((char *)local_18,"ShD");
          if (!bVar1) {
            pcVar8 = fread_string(in_stack_00003f48);
            local_20->short_descr = pcVar8;
            local_21 = 1;
          }
        }
        else {
          iVar4 = fread_number(in_stack_00002350);
          local_20->sex = (short)iVar4;
          local_21 = 1;
        }
      }
      else {
        iVar4 = fread_number(in_stack_00002350);
        local_20->saving_throw = (short)iVar4;
        local_21 = 1;
      }
    }
    if ((local_21 & 1) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (this,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff38));
      fmt_01._M_str._0_4_ = in_stack_ffffffffffffff60;
      fmt_01._M_len = (size_t)in_stack_ffffffffffffff58;
      fmt_01._M_str._4_4_ = in_stack_ffffffffffffff64;
      CLogger::Warn<>((CLogger *)in_stack_ffffffffffffff50,fmt_01);
      fread_to_eol(fp_00);
    }
  } while( true );
}

Assistant:

void fread_pet(CHAR_DATA *ch, FILE *fp)
{
	char *word;
	CHAR_DATA *pet;
	bool fMatch;
	int lastlogoff = current_time;
	int percent;

	/* first entry had BETTER be the vnum or we barf */
	word = feof(fp) ? (char *)"END" : fread_word(fp);

	if (!str_cmp(word, "Vnum"))
	{
		int vnum;

		vnum = fread_number(fp);

		if (get_mob_index(vnum) == nullptr)
		{
			RS.Logger.Warn("Fread_pet: bad vnum {}.", vnum);
			pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
		}
		else
		{
			pet = create_mobile(get_mob_index(vnum));
		}
	}
	else
	{
		RS.Logger.Warn("Fread_pet: no vnum in file.");
		pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
	}

	for (;;)
	{
		word = feof(fp) ? (char *)"END" : fread_word(fp);
		fMatch = false;

		switch (UPPER(word[0]))
		{
			case '*':
				fMatch = true;
				fread_to_eol(fp);
				break;
			case 'A':
				KEYV("Act", pet->act)
				KEYV("AfBy", pet->affected_by)
				KEY("Alig", pet->alignment, fread_number(fp))

				if (!str_cmp(word, "ACs"))
				{
					int i;

					for (i = 0; i < 4; i++)
					{
						pet->armor[i] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Affc"))
				{
					CHAR_DATA *wch = nullptr;
					char *owner;
					char *afname;
					AFFECT_DATA *paf;
					int sn;

					paf = new_affect();
					init_affect(paf);
					sn = skill_lookup(fread_word(fp));

					if (sn < 0)
						RS.Logger.Warn("Fread_char: unknown skill.");
					else
						paf->type = sn;

					paf->where = fread_number(fp);
					paf->level = fread_number(fp);
					paf->duration = fread_number(fp);
					paf->modifier = fread_number(fp);
					paf->location = fread_number(fp);

					fread_flag_new(paf->bitvector, fp);

					paf->aftype = fread_number(fp);

					owner = fread_word(fp);

					if (strcmp(owner, "none")) // safe default
						paf->owner = ch;

					for (wch = char_list; wch; wch = wch->next)
					{
						if (!str_cmp(wch->name, owner))
						{
							paf->owner = wch;
							break;
						}
					}

					afname = fread_word(fp);

					if (str_cmp(afname, "none"))
						paf->name = palloc_string(afname);

					paf->next = pet->affected;
					pet->affected = paf;
					fMatch = true;
					break;
				}

				if (!str_cmp(word, "AMod"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->mod_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Attr"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->perm_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				break;
			case 'C':
				KEYV("Comm", pet->comm)
				KEY("Cabal", pet->cabal, cabal_lookup(fread_string(fp)))
				break;
			case 'D':
				KEY("Dam", pet->damroll, fread_number(fp))
				KEY("Desc", pet->description, fread_string(fp))
				break;
			case 'E':
				if (!str_cmp(word, "End"))
				{
					pet->leader = ch;
					pet->master = ch;
					ch->pet = pet;
					/* adjust hp mana move up  -- here for speed's sake */
					percent = (current_time - lastlogoff) * 25 / (2 * 60 * 60);

					if (percent > 0 && !is_affected_by(ch, AFF_POISON) && !is_affected_by(ch, AFF_PLAGUE))
					{
						percent = std::min(percent, 100);
						pet->hit += (pet->max_hit - pet->hit) * percent / 100;
						pet->mana += (pet->max_mana - pet->mana) * percent / 100;
						pet->move += (pet->max_move - pet->move) * percent / 100;
					}

					return;
				}

				KEY("Exp", pet->exp, fread_number(fp))
				break;
			case 'G':
				KEY("Gold", pet->gold, fread_number(fp))
				break;
			case 'H':
				KEY("Hit", pet->hitroll, fread_number(fp))

				if (!str_cmp(word, "HMV"))
				{
					pet->hit = fread_number(fp);
					pet->max_hit = fread_number(fp);
					pet->mana = fread_number(fp);
					pet->max_mana = fread_number(fp);
					pet->move = fread_number(fp);
					pet->max_move = fread_number(fp);
					fMatch = true;
					break;
				}

				break;
			case 'L':
				KEY("Levl", pet->level, fread_number(fp))
				KEY("LnD", pet->long_descr, fread_string(fp))
				KEY("LogO", lastlogoff, fread_number(fp))
				break;
			case 'N':
				KEY("Name", pet->name, fread_string(fp))
				break;
			case 'P':
				KEY("Pos", pet->position, fread_number(fp))
				break;
			case 'R':
				KEY("Race", pet->race, race_lookup(fread_string(fp)))
				break;
			case 'S':
				KEY("Save", pet->saving_throw, fread_number(fp))
				KEY("Sex", pet->sex, fread_number(fp))
				KEY("ShD", pet->short_descr, fread_string(fp))
				break;
		}

		if (!fMatch)
		{
			RS.Logger.Warn("Fread_pet: no match.");
			fread_to_eol(fp);
		}
	}
}